

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * flatbuffers::DartMakeRule
                   (string *__return_storage_ptr__,Parser *parser,string *path,string *file_name)

{
  bool bVar1;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  _Self local_310;
  _Self local_308;
  iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  string local_2c8;
  string local_2a8;
  byte local_281;
  undefined1 local_280 [8];
  DartGenerator generator;
  string local_68;
  undefined1 local_48 [8];
  string filebase;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *make_rule;
  
  filebase.field_2._8_8_ = file_name;
  StripExtension(&local_68,file_name);
  StripPath((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  dart::DartGenerator::DartGenerator
            ((DartGenerator *)local_280,parser,path,(string *)filebase.field_2._8_8_);
  local_281 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"",
             (allocator<char> *)
             ((long)&included_files._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  dart::DartGenerator::Filename(&local_2a8,(DartGenerator *)local_280,&local_2c8,true);
  std::operator+(__return_storage_ptr__,&local_2a8,": ");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&included_files._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&it,parser,(string *)filebase.field_2._8_8_);
  local_308._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it);
  while( true ) {
    local_310._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it);
    bVar1 = std::operator!=(&local_308,&local_310);
    if (!bVar1) break;
    __rhs = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_308);
    std::operator+(&local_330," ",__rhs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_308);
  }
  local_281 = 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&it);
  if ((local_281 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  dart::DartGenerator::~DartGenerator((DartGenerator *)local_280);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::string DartMakeRule(const Parser &parser, const std::string &path,
                                const std::string &file_name) {
  auto filebase =
      flatbuffers::StripPath(flatbuffers::StripExtension(file_name));
  dart::DartGenerator generator(parser, path, file_name);
  auto make_rule = generator.Filename("") + ": ";

  auto included_files = parser.GetIncludedFilesRecursive(file_name);
  for (auto it = included_files.begin(); it != included_files.end(); ++it) {
    make_rule += " " + *it;
  }
  return make_rule;
}